

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

uint32_t helper_eq_h(target_ulong_conflict r1,target_ulong_conflict r2)

{
  undefined4 local_14;
  int32_t ret;
  target_ulong_conflict r2_local;
  target_ulong_conflict r1_local;
  
  local_14 = 0;
  if ((r1 & 0xffff) == (r2 & 0xffff)) {
    local_14 = 0xffff;
  }
  if ((r1 & 0xffff0000) == (r2 & 0xffff0000)) {
    local_14 = local_14 | 0xffff0000;
  }
  return local_14;
}

Assistant:

uint32_t helper_eq_h(target_ulong r1, target_ulong r2)
{
    int32_t ret = 0;

    if ((r1 & 0xffff) == (r2 & 0xffff)) {
        ret = 0xffff;
    }

    if ((r1 & 0xffff0000) == (r2 & 0xffff0000)) {
        ret |= 0xffff0000;
    }

    return ret;
}